

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

size_t bitset_extract_setbits(uint64_t *words,size_t length,uint32_t *out,uint32_t base)

{
  int iVar1;
  ulong uVar2;
  uint32_t val;
  int r;
  uint64_t t;
  uint64_t w;
  size_t i;
  int outpos;
  uint32_t base_local;
  uint32_t *out_local;
  size_t length_local;
  uint64_t *words_local;
  
  i._0_4_ = 0;
  i._4_4_ = base;
  for (w = 0; w < length; w = w + 1) {
    for (t = words[w]; t != 0; t = t & (t ^ 0xffffffffffffffff) + 1 ^ t) {
      iVar1 = 0;
      for (uVar2 = t; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x8000000000000000) {
        iVar1 = iVar1 + 1;
      }
      out[(int)i] = iVar1 + i._4_4_;
      i._0_4_ = (int)i + 1;
    }
    i._4_4_ = i._4_4_ + 0x40;
  }
  return (long)(int)i;
}

Assistant:

size_t bitset_extract_setbits(const uint64_t *words, size_t length,
                              uint32_t *out, uint32_t base) {
    int outpos = 0;
    for (size_t i = 0; i < length; ++i) {
        uint64_t w = words[i];
        while (w != 0) {
            uint64_t t = w & (~w + 1); // on x64, should compile to BLSI (careful: the Intel compiler seems to fail)
            int r = __builtin_ctzll(w); // on x64, should compile to TZCNT
            uint32_t val = r + base;
            memcpy(out + outpos, &val,
                   sizeof(uint32_t));  // should be compiled as a MOV on x64
            outpos++;
            w ^= t;
        }
        base += 64;
    }
    return outpos;
}